

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O1

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
equalityExpression(Tokenizer *tokenizer)

{
  OperatorType OVar1;
  _Head_base<0UL,_ExpressionInternal_*,_false> __p;
  Token *pTVar2;
  ExpressionInternal *this;
  OperatorType op;
  Tokenizer *in_RSI;
  char cVar3;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  undefined1 local_60 [16];
  _Head_base<0UL,_ExpressionInternal_*,_false> local_50;
  _Head_base<0UL,_ExpressionInternal_*,_false> local_48;
  __uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_40;
  __uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_38;
  
  relationalExpression((Tokenizer *)local_60);
  if ((ExpressionInternal *)local_60._0_8_ == (ExpressionInternal *)0x0) {
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  else {
    local_48._M_head_impl = (ExpressionInternal *)tokenizer;
    do {
      pTVar2 = Tokenizer::peekToken(in_RSI,0);
      OVar1 = pTVar2->type;
      op = Invalid;
      if (OVar1 == NotEqual) {
        op = OVar1;
      }
      if (OVar1 == Equal) {
        op = OVar1;
      }
      if (op == Invalid) {
        cVar3 = '\x03';
      }
      else {
        Tokenizer::eatTokens(in_RSI,1);
        relationalExpression((Tokenizer *)(local_60 + 8));
        cVar3 = (ExpressionInternal *)local_60._8_8_ == (ExpressionInternal *)0x0;
        if ((bool)cVar3) {
          *(undefined8 *)local_48._M_head_impl = 0;
        }
        else {
          this = (ExpressionInternal *)operator_new(0x50);
          local_38._M_t.
          super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
          super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
               (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
               (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)local_60._0_8_
          ;
          local_60._0_8_ =
               (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0
          ;
          local_40._M_t.
          super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
          super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
               (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
               (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)local_60._8_8_
          ;
          local_60._8_8_ = (ExpressionInternal *)0x0;
          ExpressionInternal::
          ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                    (this,op,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                              *)&local_38,
                     (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_40);
          local_50._M_head_impl = this;
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_40);
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_38);
          __p._M_head_impl = local_50._M_head_impl;
          local_50._M_head_impl = (ExpressionInternal *)0x0;
          std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
                    ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                      *)local_60,__p._M_head_impl);
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_50);
        }
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_60 + 8));
      }
    } while (cVar3 == '\0');
    tokenizer = (Tokenizer *)local_48._M_head_impl;
    if (cVar3 == '\x03') {
      *(undefined8 *)local_48._M_head_impl = local_60._0_8_;
      local_60._0_8_ = (ExpressionInternal *)0x0;
    }
  }
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_60);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> equalityExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = relationalExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	while (true)
	{
		OperatorType op = OperatorType::Invalid;
		switch (tokenizer.peekToken().type)
		{
		case TokenType::Equal:
			op = OperatorType::Equal;
			break;
		case TokenType::NotEqual:
			op = OperatorType::NotEqual;
			break;
		default:
			break;
		}

		if (op == OperatorType::Invalid)
			break;

		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = relationalExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;

		exp = std::make_unique<ExpressionInternal>(op, std::move(exp), std::move(exp2));
	}

	return exp;
}